

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O1

uint64_t search_one_dual(int *lev0,int *lev1,int nb_strengths,uint64_t (**mse) [64],int sb_count,
                        CDEF_PICK_METHOD pick_method)

{
  uint uVar1;
  uint64_t (*pauVar2) [64];
  uint64_t uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint64_t (*pauVar7) [64];
  ulong uVar8;
  ulong uVar9;
  undefined1 *puVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 *__s;
  int k;
  ulong uVar14;
  bool bVar15;
  uint64_t tot_mse [64] [64];
  undefined1 local_8038 [32776];
  
  uVar14 = 0x8000000000000000;
  uVar1 = nb_cdef_strengths[pick_method];
  __s = local_8038;
  uVar6 = 0;
  memset(__s,0,0x8000);
  if (0 < sb_count) {
    uVar4 = 1;
    if (1 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    pauVar2 = *mse;
    pauVar7 = mse[1];
    uVar9 = 0;
    do {
      uVar11 = 0x8000000000000000;
      if (0 < nb_strengths) {
        uVar13 = 0;
        uVar11 = 0x8000000000000000;
        do {
          uVar12 = mse[1][uVar9][lev1[uVar13]] + (*mse)[uVar9][lev0[uVar13]];
          if (uVar11 <= uVar12) {
            uVar12 = uVar11;
          }
          uVar11 = uVar12;
          uVar13 = uVar13 + 1;
        } while ((uint)nb_strengths != uVar13);
      }
      puVar10 = local_8038;
      uVar13 = 0;
      do {
        uVar3 = pauVar2[uVar9][uVar13];
        uVar12 = 0;
        do {
          uVar8 = (*pauVar7)[uVar12] + uVar3;
          if (uVar11 <= uVar8) {
            uVar8 = uVar11;
          }
          *(ulong *)(puVar10 + uVar12 * 8) = *(long *)(puVar10 + uVar12 * 8) + uVar8;
          uVar12 = uVar12 + 1;
        } while (uVar4 != uVar12);
        uVar13 = uVar13 + 1;
        puVar10 = puVar10 + 0x200;
      } while (uVar13 != uVar4);
      uVar9 = uVar9 + 1;
      pauVar7 = pauVar7 + 1;
    } while (uVar9 != (uint)sb_count);
  }
  uVar4 = 1;
  if (1 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  uVar9 = 0;
  iVar5 = 0;
  do {
    uVar11 = 0;
    do {
      uVar13 = *(ulong *)(__s + uVar11 * 8);
      bVar15 = uVar13 < uVar14;
      if (bVar15) {
        uVar14 = uVar13;
      }
      if (bVar15) {
        uVar6 = uVar11 & 0xffffffff;
        iVar5 = (int)uVar9;
      }
      uVar11 = uVar11 + 1;
    } while (uVar4 != uVar11);
    uVar9 = uVar9 + 1;
    __s = __s + 0x200;
  } while (uVar9 != uVar4);
  lev0[nb_strengths] = iVar5;
  lev1[nb_strengths] = (int)uVar6;
  return uVar14;
}

Assistant:

static uint64_t search_one_dual(int *lev0, int *lev1, int nb_strengths,
                                uint64_t (**mse)[TOTAL_STRENGTHS], int sb_count,
                                CDEF_PICK_METHOD pick_method) {
  uint64_t tot_mse[TOTAL_STRENGTHS][TOTAL_STRENGTHS];
  int i, j;
  uint64_t best_tot_mse = (uint64_t)1 << 63;
  int best_id0 = 0;
  int best_id1 = 0;
  const int total_strengths = nb_cdef_strengths[pick_method];
  memset(tot_mse, 0, sizeof(tot_mse));
  for (i = 0; i < sb_count; i++) {
    int gi;
    uint64_t best_mse = (uint64_t)1 << 63;
    /* Find best mse among already selected options. */
    for (gi = 0; gi < nb_strengths; gi++) {
      uint64_t curr = mse[0][i][lev0[gi]];
      curr += mse[1][i][lev1[gi]];
      if (curr < best_mse) {
        best_mse = curr;
      }
    }
    /* Find best mse when adding each possible new option. */
    for (j = 0; j < total_strengths; j++) {
      int k;
      for (k = 0; k < total_strengths; k++) {
        uint64_t best = best_mse;
        uint64_t curr = mse[0][i][j];
        curr += mse[1][i][k];
        if (curr < best) best = curr;
        tot_mse[j][k] += best;
      }
    }
  }
  for (j = 0; j < total_strengths; j++) {
    int k;
    for (k = 0; k < total_strengths; k++) {
      if (tot_mse[j][k] < best_tot_mse) {
        best_tot_mse = tot_mse[j][k];
        best_id0 = j;
        best_id1 = k;
      }
    }
  }
  lev0[nb_strengths] = best_id0;
  lev1[nb_strengths] = best_id1;
  return best_tot_mse;
}